

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

void __thiscall Plan::ScheduleWork(Plan *this,iterator want_e)

{
  bool bVar1;
  pointer ppVar2;
  Pool *this_00;
  Pool *pool;
  Edge *edge;
  Plan *this_local;
  iterator want_e_local;
  
  edge = (Edge *)this;
  this_local = (Plan *)want_e._M_node;
  ppVar2 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->
                     ((_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_> *)&this_local);
  if (ppVar2->second != kWantToFinish) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->
                       ((_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_> *)&this_local);
    if (ppVar2->second != kWantToStart) {
      __assert_fail("want_e->second == kWantToStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                    ,0x18e,"void Plan::ScheduleWork(map<Edge *, Want>::iterator)");
    }
    ppVar2 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->
                       ((_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_> *)&this_local);
    ppVar2->second = kWantToFinish;
    ppVar2 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_>::operator->
                       ((_Rb_tree_iterator<std::pair<Edge_*const,_Plan::Want>_> *)&this_local);
    pool = (Pool *)ppVar2->first;
    this_00 = Edge::pool((Edge *)pool);
    bVar1 = Pool::ShouldDelayEdge(this_00);
    if (bVar1) {
      Pool::DelayEdge(this_00,(Edge *)pool);
      Pool::RetrieveReadyEdges(this_00,&this->ready_);
    }
    else {
      Pool::EdgeScheduled(this_00,(Edge *)pool);
      std::set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_>::insert
                (&this->ready_,(value_type *)&pool);
    }
  }
  return;
}

Assistant:

void Plan::ScheduleWork(map<Edge*, Want>::iterator want_e) {
  if (want_e->second == kWantToFinish) {
    // This edge has already been scheduled.  We can get here again if an edge
    // and one of its dependencies share an order-only input, or if a node
    // duplicates an out edge (see https://github.com/ninja-build/ninja/pull/519).
    // Avoid scheduling the work again.
    return;
  }
  assert(want_e->second == kWantToStart);
  want_e->second = kWantToFinish;

  Edge* edge = want_e->first;
  Pool* pool = edge->pool();
  if (pool->ShouldDelayEdge()) {
    pool->DelayEdge(edge);
    pool->RetrieveReadyEdges(&ready_);
  } else {
    pool->EdgeScheduled(*edge);
    ready_.insert(edge);
  }
}